

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O3

void __thiscall
xray_re::xr_bone::calculate_motion(xr_bone *this,xr_skl_motion *sm,fmatrix *parent_xform)

{
  fmatrix *b;
  fmatrix *this_00;
  byte bVar1;
  pointer ppxVar2;
  pointer ppxVar3;
  _matrix<float> *a;
  pointer ppxVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  anon_union_64_4_b9f67276_for__matrix<float>_1 local_b8;
  anon_union_64_4_b9f67276_for__matrix<float>_1 local_78;
  
  ppxVar2 = (sm->m_bone_motions).
            super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)this->m_id <
      (ulong)((long)(sm->m_bone_motions).
                    super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppxVar2 >> 3)) {
    bVar1 = ppxVar2[this->m_id]->m_flags;
    b = &this->m_mot_xform;
    fVar5 = -(this->m_mot_rotate).field_0.field_0.y;
    fVar10 = -(this->m_mot_rotate).field_0.field_0.x;
    fVar9 = -(this->m_mot_rotate).field_0.field_0.z;
    fVar6 = sinf(fVar5);
    fVar5 = cosf(fVar5);
    fVar7 = sinf(fVar10);
    fVar10 = cosf(fVar10);
    fVar8 = sinf(fVar9);
    fVar9 = cosf(fVar9);
    (this->m_mot_xform).field_0.field_0._11 = fVar5 * fVar9 - fVar8 * fVar6 * fVar7;
    (this->m_mot_xform).field_0.field_0._12 = fVar8 * -fVar10;
    (this->m_mot_xform).field_0.field_0._13 = fVar5 * fVar8 * fVar7 + fVar6 * fVar9;
    (this->m_mot_xform).field_0.field_0._14 = 0.0;
    (this->m_mot_xform).field_0.field_0._21 = fVar6 * fVar7 * fVar9 + fVar5 * fVar8;
    (this->m_mot_xform).field_0.field_0._22 = fVar10 * fVar9;
    (this->m_mot_xform).field_0.field_0._23 = fVar8 * fVar6 - fVar5 * fVar7 * fVar9;
    (this->m_mot_xform).field_0.field_0._24 = 0.0;
    (this->m_mot_xform).field_0.field_0._31 = -fVar10 * fVar6;
    (this->m_mot_xform).field_0.field_0._32 = fVar7;
    (this->m_mot_xform).field_0.field_0._33 = fVar5 * fVar10;
    *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 0x2c) = 0;
    (this->m_mot_xform).field_0.field_0._44 = 1.0;
    *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 0x30) =
         *(undefined8 *)&(this->m_mot_offset).field_0;
    (this->m_mot_xform).field_0.field_0._43 = (this->m_mot_offset).field_0.field_0.z;
    this_00 = &this->m_last_xform;
    _matrix<float>::mul(this_00,parent_xform,b);
    if ((bVar1 & 1) != 0) {
      *(undefined8 *)&(this->m_last_xform).field_0 = *(undefined8 *)&(this->m_mot_xform).field_0;
      (this->m_last_xform).field_0.field_0._13 = (this->m_mot_xform).field_0.field_0._13;
      *(undefined8 *)((long)&(this->m_last_xform).field_0 + 0x10) =
           *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 0x10);
      (this->m_last_xform).field_0.field_0._23 = (this->m_mot_xform).field_0.field_0._23;
      *(undefined8 *)((long)&(this->m_last_xform).field_0 + 0x20) =
           *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 0x20);
      (this->m_last_xform).field_0.field_0._33 = (this->m_mot_xform).field_0.field_0._33;
      local_b8._48_8_ = 0;
      local_b8._56_8_ = 0;
      local_b8._32_8_ = 0;
      local_b8._40_8_ = 0;
      local_b8._16_8_ = 0;
      local_b8._24_8_ = 0;
      local_b8._0_8_ = 0;
      local_b8._8_8_ = 0;
      a = _matrix<float>::invert_43((_matrix<float> *)&local_b8.field_0,parent_xform);
      local_78._0_8_ = *(undefined8 *)&b->field_0;
      local_78._8_8_ = *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 8);
      local_78._16_8_ = *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 0x10);
      local_78._24_8_ = *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 0x18);
      local_78._32_8_ = *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 0x20);
      local_78._40_8_ = *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 0x28);
      local_78._48_8_ = *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 0x30);
      local_78._56_8_ = *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 0x38);
      _matrix<float>::mul_43(b,a,(_matrix<float> *)&local_78.field_0);
    }
    _matrix<float>::mul_43(&this->m_render_xform,this_00,&this->m_bind_i_xform);
    ppxVar3 = (this->m_children).
              super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppxVar4 = (this->m_children).
                   super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppxVar4 != ppxVar3;
        ppxVar4 = ppxVar4 + 1) {
      calculate_motion(*ppxVar4,sm,this_00);
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void xr_bone::calculate_motion(xr_skl_motion* sm, const fmatrix& parent_xform)
{
	uint8_t flags = sm->bone_motion_flags(m_id);
	if (flags & xr_bone_motion::BMF_WORLD_ORIENT) {
		m_mot_xform.set_xyz_i(m_mot_rotate);
		m_mot_xform.c.set(m_mot_offset);
		m_last_xform.mul(parent_xform, m_mot_xform);

		m_last_xform.i.set(m_mot_xform.i);
		m_last_xform.j.set(m_mot_xform.j);
		m_last_xform.k.set(m_mot_xform.k);

		m_mot_xform.mul_a_43(fmatrix().invert_43(parent_xform));
	} else {
		m_mot_xform.set_xyz_i(m_mot_rotate);
		m_mot_xform.c.set(m_mot_offset);
		m_last_xform.mul(parent_xform, m_mot_xform);
	}
	m_render_xform.mul_43(m_last_xform, m_bind_i_xform);
	for (xr_bone_vec_it it = m_children.begin(), end = m_children.end(); it != end; ++it)
		(*it)->calculate_motion(sm, m_last_xform);
}